

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jddctmgr.c
# Opt level: O2

void start_pass(j_decompress_ptr cinfo)

{
  double dVar1;
  int iVar2;
  jpeg_inverse_dct *pjVar3;
  JQUANT_TBL *pJVar4;
  void *pvVar5;
  jpeg_error_mgr *pjVar6;
  int iVar7;
  int row;
  long lVar8;
  J_DCT_METHOD JVar9;
  J_DCT_METHOD JVar10;
  code *pcVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  jpeg_component_info *pjVar15;
  
  pjVar15 = cinfo->comp_info;
  pjVar3 = cinfo->idct;
  lVar14 = 0;
  pcVar11 = (inverse_DCT_method_ptr)0x0;
  JVar9 = JDCT_ISLOW;
  do {
    if (cinfo->num_components <= lVar14) {
      return;
    }
    iVar2 = pjVar15->DCT_h_scaled_size;
    iVar7 = iVar2 * 0x100 + pjVar15->DCT_v_scaled_size;
    if (iVar7 == 0x101) {
      pcVar11 = jpeg_idct_1x1;
LAB_0023ddb7:
      JVar10 = JDCT_ISLOW;
    }
    else {
      if (iVar7 == 0x102) {
        pcVar11 = jpeg_idct_1x2;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x201) {
        pcVar11 = jpeg_idct_2x1;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x1010) {
        pcVar11 = jpeg_idct_16x16;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x204) {
        pcVar11 = jpeg_idct_2x4;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x303) {
        pcVar11 = jpeg_idct_3x3;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x306) {
        pcVar11 = jpeg_idct_3x6;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x402) {
        pcVar11 = jpeg_idct_4x2;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x404) {
        pcVar11 = jpeg_idct_4x4;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x408) {
        pcVar11 = jpeg_idct_4x8;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x505) {
        pcVar11 = jpeg_idct_5x5;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x50a) {
        pcVar11 = jpeg_idct_5x10;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x603) {
        pcVar11 = jpeg_idct_6x3;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x606) {
        pcVar11 = jpeg_idct_6x6;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x60c) {
        pcVar11 = jpeg_idct_6x12;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x707) {
        pcVar11 = jpeg_idct_7x7;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x70e) {
        pcVar11 = jpeg_idct_7x14;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x804) {
        pcVar11 = jpeg_idct_8x4;
        goto LAB_0023ddb7;
      }
      if (iVar7 != 0x808) {
        if (iVar7 == 0x810) {
          pcVar11 = jpeg_idct_8x16;
        }
        else if (iVar7 == 0x909) {
          pcVar11 = jpeg_idct_9x9;
        }
        else if (iVar7 == 0xa05) {
          pcVar11 = jpeg_idct_10x5;
        }
        else if (iVar7 == 0xa0a) {
          pcVar11 = jpeg_idct_10x10;
        }
        else if (iVar7 == 0xb0b) {
          pcVar11 = jpeg_idct_11x11;
        }
        else if (iVar7 == 0xc06) {
          pcVar11 = jpeg_idct_12x6;
        }
        else if (iVar7 == 0xc0c) {
          pcVar11 = jpeg_idct_12x12;
        }
        else if (iVar7 == 0xd0d) {
          pcVar11 = jpeg_idct_13x13;
        }
        else if (iVar7 == 0xe07) {
          pcVar11 = jpeg_idct_14x7;
        }
        else if (iVar7 == 0xe0e) {
          pcVar11 = jpeg_idct_14x14;
        }
        else if (iVar7 == 0xf0f) {
          pcVar11 = jpeg_idct_15x15;
        }
        else if (iVar7 == 0x1008) {
          pcVar11 = jpeg_idct_16x8;
        }
        else {
          if (iVar7 != 0x202) {
            pjVar6 = cinfo->err;
            pjVar6->msg_code = 7;
            (pjVar6->msg_parm).i[0] = iVar2;
            (cinfo->err->msg_parm).i[1] = pjVar15->DCT_v_scaled_size;
            pjVar6 = cinfo->err;
            goto LAB_0023de84;
          }
          pcVar11 = jpeg_idct_2x2;
        }
        goto LAB_0023ddb7;
      }
      JVar10 = cinfo->dct_method;
      if ((ulong)JVar10 < 3) {
        pcVar11 = (code *)(&PTR_jpeg_idct_islow_00378500)[JVar10];
      }
      else {
        pjVar6 = cinfo->err;
        pjVar6->msg_code = 0x31;
LAB_0023de84:
        (*pjVar6->error_exit)((j_common_ptr)cinfo);
        JVar10 = JVar9;
      }
    }
    pjVar3->inverse_DCT[lVar14] = pcVar11;
    if (((pjVar15->component_needed != 0) &&
        (*(J_DCT_METHOD *)((long)pjVar3[1].inverse_DCT + lVar14 * 4 + -8) != JVar10)) &&
       (pJVar4 = pjVar15->quant_table, pJVar4 != (JQUANT_TBL *)0x0)) {
      *(J_DCT_METHOD *)((long)pjVar3[1].inverse_DCT + lVar14 * 4 + -8) = JVar10;
      pvVar5 = pjVar15->dct_table;
      lVar8 = 0;
      if (JVar10 == JDCT_ISLOW) {
        for (; lVar8 != 0x40; lVar8 = lVar8 + 1) {
          *(uint *)((long)pvVar5 + lVar8 * 4) = (uint)pJVar4->quantval[lVar8];
        }
      }
      else if (JVar10 == JDCT_IFAST) {
        for (; lVar8 != 0x80; lVar8 = lVar8 + 2) {
          *(int *)((long)pvVar5 + lVar8 * 2) =
               (int)((long)*(short *)((long)start_pass::aanscales + lVar8) *
                     (ulong)*(ushort *)((long)pJVar4->quantval + lVar8) + 0x800 >> 0xc);
        }
      }
      else {
        lVar12 = 0;
        for (; lVar8 != 8; lVar8 = lVar8 + 1) {
          dVar1 = start_pass::aanscalefactor[lVar8];
          lVar12 = (long)(int)lVar12;
          for (lVar13 = 0; lVar13 != 0x40; lVar13 = lVar13 + 8) {
            *(float *)((long)pvVar5 + lVar12 * 4) =
                 (float)((double)pJVar4->quantval[lVar12] * dVar1 *
                         *(double *)((long)start_pass::aanscalefactor + lVar13) * 0.125);
            lVar12 = lVar12 + 1;
          }
        }
      }
    }
    lVar14 = lVar14 + 1;
    pjVar15 = pjVar15 + 1;
    JVar9 = JVar10;
  } while( true );
}

Assistant:

METHODDEF(void)
start_pass (j_decompress_ptr cinfo)
{
  my_idct_ptr idct = (my_idct_ptr) cinfo->idct;
  int ci, i;
  jpeg_component_info *compptr;
  int method = 0;
  inverse_DCT_method_ptr method_ptr = NULL;
  JQUANT_TBL * qtbl;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Select the proper IDCT routine for this component's scaling */
    switch ((compptr->DCT_h_scaled_size << 8) + compptr->DCT_v_scaled_size) {
#ifdef IDCT_SCALING_SUPPORTED
    case ((1 << 8) + 1):
      method_ptr = jpeg_idct_1x1;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((2 << 8) + 2):
      method_ptr = jpeg_idct_2x2;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((3 << 8) + 3):
      method_ptr = jpeg_idct_3x3;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((4 << 8) + 4):
      method_ptr = jpeg_idct_4x4;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((5 << 8) + 5):
      method_ptr = jpeg_idct_5x5;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((6 << 8) + 6):
      method_ptr = jpeg_idct_6x6;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((7 << 8) + 7):
      method_ptr = jpeg_idct_7x7;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((9 << 8) + 9):
      method_ptr = jpeg_idct_9x9;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((10 << 8) + 10):
      method_ptr = jpeg_idct_10x10;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((11 << 8) + 11):
      method_ptr = jpeg_idct_11x11;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((12 << 8) + 12):
      method_ptr = jpeg_idct_12x12;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((13 << 8) + 13):
      method_ptr = jpeg_idct_13x13;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((14 << 8) + 14):
      method_ptr = jpeg_idct_14x14;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((15 << 8) + 15):
      method_ptr = jpeg_idct_15x15;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((16 << 8) + 16):
      method_ptr = jpeg_idct_16x16;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((16 << 8) + 8):
      method_ptr = jpeg_idct_16x8;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((14 << 8) + 7):
      method_ptr = jpeg_idct_14x7;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((12 << 8) + 6):
      method_ptr = jpeg_idct_12x6;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((10 << 8) + 5):
      method_ptr = jpeg_idct_10x5;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((8 << 8) + 4):
      method_ptr = jpeg_idct_8x4;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((6 << 8) + 3):
      method_ptr = jpeg_idct_6x3;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((4 << 8) + 2):
      method_ptr = jpeg_idct_4x2;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((2 << 8) + 1):
      method_ptr = jpeg_idct_2x1;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((8 << 8) + 16):
      method_ptr = jpeg_idct_8x16;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((7 << 8) + 14):
      method_ptr = jpeg_idct_7x14;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((6 << 8) + 12):
      method_ptr = jpeg_idct_6x12;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((5 << 8) + 10):
      method_ptr = jpeg_idct_5x10;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((4 << 8) + 8):
      method_ptr = jpeg_idct_4x8;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((3 << 8) + 6):
      method_ptr = jpeg_idct_3x6;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((2 << 8) + 4):
      method_ptr = jpeg_idct_2x4;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((1 << 8) + 2):
      method_ptr = jpeg_idct_1x2;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
#endif
    case ((DCTSIZE << 8) + DCTSIZE):
      switch (cinfo->dct_method) {
#ifdef DCT_ISLOW_SUPPORTED
      case JDCT_ISLOW:
	method_ptr = jpeg_idct_islow;
	method = JDCT_ISLOW;
	break;
#endif
#ifdef DCT_IFAST_SUPPORTED
      case JDCT_IFAST:
	method_ptr = jpeg_idct_ifast;
	method = JDCT_IFAST;
	break;
#endif
#ifdef DCT_FLOAT_SUPPORTED
      case JDCT_FLOAT:
	method_ptr = jpeg_idct_float;
	method = JDCT_FLOAT;
	break;
#endif
      default:
	ERREXIT(cinfo, JERR_NOT_COMPILED);
	break;
      }
      break;
    default:
      ERREXIT2(cinfo, JERR_BAD_DCTSIZE,
	       compptr->DCT_h_scaled_size, compptr->DCT_v_scaled_size);
      break;
    }
    idct->pub.inverse_DCT[ci] = method_ptr;
    /* Create multiplier table from quant table.
     * However, we can skip this if the component is uninteresting
     * or if we already built the table.  Also, if no quant table
     * has yet been saved for the component, we leave the
     * multiplier table all-zero; we'll be reading zeroes from the
     * coefficient controller's buffer anyway.
     */
    if (! compptr->component_needed || idct->cur_method[ci] == method)
      continue;
    qtbl = compptr->quant_table;
    if (qtbl == NULL)		/* happens if no data yet for component */
      continue;
    idct->cur_method[ci] = method;
    switch (method) {
#ifdef PROVIDE_ISLOW_TABLES
    case JDCT_ISLOW:
      {
	/* For LL&M IDCT method, multipliers are equal to raw quantization
	 * coefficients, but are stored as ints to ensure access efficiency.
	 */
	ISLOW_MULT_TYPE * ismtbl = (ISLOW_MULT_TYPE *) compptr->dct_table;
	for (i = 0; i < DCTSIZE2; i++) {
	  ismtbl[i] = (ISLOW_MULT_TYPE) qtbl->quantval[i];
	}
      }
      break;
#endif
#ifdef DCT_IFAST_SUPPORTED
    case JDCT_IFAST:
      {
	/* For AA&N IDCT method, multipliers are equal to quantization
	 * coefficients scaled by scalefactor[row]*scalefactor[col], where
	 *   scalefactor[0] = 1
	 *   scalefactor[k] = cos(k*PI/16) * sqrt(2)    for k=1..7
	 * For integer operation, the multiplier table is to be scaled by
	 * IFAST_SCALE_BITS.
	 */
	IFAST_MULT_TYPE * ifmtbl = (IFAST_MULT_TYPE *) compptr->dct_table;
#define CONST_BITS 14
	static const INT16 aanscales[DCTSIZE2] = {
	  /* precomputed values scaled up by 14 bits */
	  16384, 22725, 21407, 19266, 16384, 12873,  8867,  4520,
	  22725, 31521, 29692, 26722, 22725, 17855, 12299,  6270,
	  21407, 29692, 27969, 25172, 21407, 16819, 11585,  5906,
	  19266, 26722, 25172, 22654, 19266, 15137, 10426,  5315,
	  16384, 22725, 21407, 19266, 16384, 12873,  8867,  4520,
	  12873, 17855, 16819, 15137, 12873, 10114,  6967,  3552,
	   8867, 12299, 11585, 10426,  8867,  6967,  4799,  2446,
	   4520,  6270,  5906,  5315,  4520,  3552,  2446,  1247
	};
	SHIFT_TEMPS

	for (i = 0; i < DCTSIZE2; i++) {
	  ifmtbl[i] = (IFAST_MULT_TYPE)
	    DESCALE(MULTIPLY16V16((INT32) qtbl->quantval[i],
				  (INT32) aanscales[i]),
		    CONST_BITS-IFAST_SCALE_BITS);
	}
      }
      break;
#endif
#ifdef DCT_FLOAT_SUPPORTED
    case JDCT_FLOAT:
      {
	/* For float AA&N IDCT method, multipliers are equal to quantization
	 * coefficients scaled by scalefactor[row]*scalefactor[col], where
	 *   scalefactor[0] = 1
	 *   scalefactor[k] = cos(k*PI/16) * sqrt(2)    for k=1..7
	 * We apply a further scale factor of 1/8.
	 */
	FLOAT_MULT_TYPE * fmtbl = (FLOAT_MULT_TYPE *) compptr->dct_table;
	int row, col;
	static const double aanscalefactor[DCTSIZE] = {
	  1.0, 1.387039845, 1.306562965, 1.175875602,
	  1.0, 0.785694958, 0.541196100, 0.275899379
	};

	i = 0;
	for (row = 0; row < DCTSIZE; row++) {
	  for (col = 0; col < DCTSIZE; col++) {
	    fmtbl[i] = (FLOAT_MULT_TYPE)
	      ((double) qtbl->quantval[i] *
	       aanscalefactor[row] * aanscalefactor[col] * 0.125);
	    i++;
	  }
	}
      }
      break;
#endif
    default:
      ERREXIT(cinfo, JERR_NOT_COMPILED);
      break;
    }
  }
}